

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

ostream * std::operator<<(ostream *o,StackInst *inst)

{
  Try *pTVar1;
  char *pcVar2;
  string_view str;
  string_view str_00;
  string_view str_01;
  ulong uStack_1d0;
  undefined1 local_1c8 [8];
  PrintSExpression printer;
  
  ::wasm::PrintSExpression::PrintSExpression((PrintSExpression *)local_1c8,o);
  uStack_1d0 = (ulong)inst->op;
  switch(uStack_1d0) {
  case 0:
  case 1:
  case 3:
  case 6:
  case 8:
    ::wasm::PrintExpressionContents::PrintExpressionContents
              ((PrintExpressionContents *)&printer.typePrinter.fallbackNames._M_h._M_single_bucket,
               (PrintSExpression *)local_1c8);
    ::wasm::Visitor<wasm::PrintExpressionContents,_void>::visit
              ((Visitor<wasm::PrintExpressionContents,_void> *)
               &printer.typePrinter.fallbackNames._M_h._M_single_bucket,inst->origin);
    goto LAB_00b1c891;
  case 2:
  case 5:
  case 7:
  case 0xc:
    str._M_str = "end";
    str._M_len = 3;
    printMedium(o,str);
    std::operator<<(o," ;; type: ");
    ::wasm::PrintSExpression::printType((PrintSExpression *)local_1c8,(Type)(inst->type).id);
    goto LAB_00b1c891;
  case 4:
    pcVar2 = "else";
    break;
  case 9:
    pcVar2 = "catch";
    uStack_1d0 = 5;
    break;
  case 10:
    pcVar2 = "catch_all";
    uStack_1d0 = 9;
    break;
  case 0xb:
    str_00._M_str = "delegate ";
    str_00._M_len = 9;
    printMedium(o,str_00);
    pTVar1 = ::wasm::Expression::cast<wasm::Try>(inst->origin);
    ::wasm::Name::print(&pTVar1->delegateTarget,o);
    goto LAB_00b1c891;
  default:
    ::wasm::handle_unreachable
              ("unexpeted op",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
               ,0xe72);
  }
  str_01._M_str = pcVar2;
  str_01._M_len = uStack_1d0;
  printMedium(o,str_01);
LAB_00b1c891:
  ::wasm::PrintSExpression::~PrintSExpression((PrintSExpression *)local_1c8);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::StackInst& inst) {
  return wasm::printStackInst(&inst, o);
}